

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adbc.cpp
# Opt level: O2

AdbcStatusCode
duckdb_adbc::DatabaseSetOption(AdbcDatabase *database,char *key,char *value,AdbcError *error)

{
  undefined8 *puVar1;
  AdbcStatusCode AVar2;
  int iVar3;
  duckdb_state res;
  allocator local_41;
  string local_40;
  
  if (database == (AdbcDatabase *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"Missing database object",&local_41);
    SetError(error,&local_40);
  }
  else {
    if (key != (char *)0x0) {
      puVar1 = (undefined8 *)database->private_data;
      iVar3 = strcmp(key,"path");
      if (iVar3 != 0) {
        local_40._M_dataplus._M_p._0_4_ = duckdb_set_config((duckdb_config)*puVar1,key,value);
        AVar2 = CheckResult((duckdb_state *)&local_40,error,"Failed to set configuration option");
        return AVar2;
      }
      std::__cxx11::string::assign((char *)(puVar1 + 2));
      return '\0';
    }
    std::__cxx11::string::string((string *)&local_40,"Missing key",&local_41);
    SetError(error,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return '\x05';
}

Assistant:

AdbcStatusCode DatabaseSetOption(struct AdbcDatabase *database, const char *key, const char *value,
                                 struct AdbcError *error) {
	if (!database) {
		SetError(error, "Missing database object");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}
	if (!key) {
		SetError(error, "Missing key");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}

	auto wrapper = static_cast<DuckDBAdbcDatabaseWrapper *>(database->private_data);
	if (strcmp(key, "path") == 0) {
		wrapper->path = value;
		return ADBC_STATUS_OK;
	}
	auto res = duckdb_set_config(wrapper->config, key, value);

	return CheckResult(res, error, "Failed to set configuration option");
}